

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_translate.c
# Opt level: O0

__m256i * enc_translate(__m256i in)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  __m256i mask;
  __m256i indices;
  __m256i lut;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_150;
  undefined8 uStack_148;
  
  auVar1 = vpinsrb_avx(ZEXT116(0x41),0x47,1);
  auVar1 = vpinsrb_avx(auVar1,0xfc,2);
  auVar1 = vpinsrb_avx(auVar1,0xfc,3);
  auVar1 = vpinsrb_avx(auVar1,0xfc,4);
  auVar1 = vpinsrb_avx(auVar1,0xfc,5);
  auVar1 = vpinsrb_avx(auVar1,0xfc,6);
  auVar1 = vpinsrb_avx(auVar1,0xfc,7);
  auVar1 = vpinsrb_avx(auVar1,0xfc,8);
  auVar1 = vpinsrb_avx(auVar1,0xfc,9);
  auVar1 = vpinsrb_avx(auVar1,0xfc,10);
  auVar1 = vpinsrb_avx(auVar1,0xfc,0xb);
  auVar1 = vpinsrb_avx(auVar1,0xed,0xc);
  auVar1 = vpinsrb_avx(auVar1,0xf0,0xd);
  auVar1 = vpinsrb_avx(auVar1,0,0xe);
  auVar1 = vpinsrb_avx(auVar1,0,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(0x41),0x47,1);
  auVar2 = vpinsrb_avx(auVar2,0xfc,2);
  auVar2 = vpinsrb_avx(auVar2,0xfc,3);
  auVar2 = vpinsrb_avx(auVar2,0xfc,4);
  auVar2 = vpinsrb_avx(auVar2,0xfc,5);
  auVar2 = vpinsrb_avx(auVar2,0xfc,6);
  auVar2 = vpinsrb_avx(auVar2,0xfc,7);
  auVar2 = vpinsrb_avx(auVar2,0xfc,8);
  auVar2 = vpinsrb_avx(auVar2,0xfc,9);
  auVar2 = vpinsrb_avx(auVar2,0xfc,10);
  auVar2 = vpinsrb_avx(auVar2,0xfc,0xb);
  auVar2 = vpinsrb_avx(auVar2,0xed,0xc);
  auVar2 = vpinsrb_avx(auVar2,0xf0,0xd);
  auVar2 = vpinsrb_avx(auVar2,0,0xe);
  auVar2 = vpinsrb_avx(auVar2,0,0xf);
  uStack_250 = auVar2._0_8_;
  uStack_248 = auVar2._8_8_;
  auVar2 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
  auVar2 = vpinsrb_avx(auVar2,0x33,2);
  auVar2 = vpinsrb_avx(auVar2,0x33,3);
  auVar2 = vpinsrb_avx(auVar2,0x33,4);
  auVar2 = vpinsrb_avx(auVar2,0x33,5);
  auVar2 = vpinsrb_avx(auVar2,0x33,6);
  auVar2 = vpinsrb_avx(auVar2,0x33,7);
  auVar2 = vpinsrb_avx(auVar2,0x33,8);
  auVar2 = vpinsrb_avx(auVar2,0x33,9);
  auVar2 = vpinsrb_avx(auVar2,0x33,10);
  auVar2 = vpinsrb_avx(auVar2,0x33,0xb);
  auVar2 = vpinsrb_avx(auVar2,0x33,0xc);
  auVar2 = vpinsrb_avx(auVar2,0x33,0xd);
  auVar2 = vpinsrb_avx(auVar2,0x33,0xe);
  auVar2 = vpinsrb_avx(auVar2,0x33,0xf);
  auVar3 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
  auVar3 = vpinsrb_avx(auVar3,0x33,2);
  auVar3 = vpinsrb_avx(auVar3,0x33,3);
  auVar3 = vpinsrb_avx(auVar3,0x33,4);
  auVar3 = vpinsrb_avx(auVar3,0x33,5);
  auVar3 = vpinsrb_avx(auVar3,0x33,6);
  auVar3 = vpinsrb_avx(auVar3,0x33,7);
  auVar3 = vpinsrb_avx(auVar3,0x33,8);
  auVar3 = vpinsrb_avx(auVar3,0x33,9);
  auVar3 = vpinsrb_avx(auVar3,0x33,10);
  auVar3 = vpinsrb_avx(auVar3,0x33,0xb);
  auVar3 = vpinsrb_avx(auVar3,0x33,0xc);
  auVar3 = vpinsrb_avx(auVar3,0x33,0xd);
  auVar3 = vpinsrb_avx(auVar3,0x33,0xe);
  auVar3 = vpinsrb_avx(auVar3,0x33,0xf);
  uStack_150 = auVar3._0_8_;
  uStack_148 = auVar3._8_8_;
  auVar6._8_8_ = in_XMM0_Qb;
  auVar6._0_8_ = in_XMM0_Qa;
  auVar6._16_8_ = in_YMM0_H;
  auVar6._24_8_ = in_register_00001218;
  auVar4._16_8_ = uStack_150;
  auVar4._0_16_ = auVar2;
  auVar4._24_8_ = uStack_148;
  auVar5 = vpsubusb_avx2(auVar6,auVar4);
  auVar2 = vpinsrb_avx(ZEXT116(0x19),0x19,1);
  auVar2 = vpinsrb_avx(auVar2,0x19,2);
  auVar2 = vpinsrb_avx(auVar2,0x19,3);
  auVar2 = vpinsrb_avx(auVar2,0x19,4);
  auVar2 = vpinsrb_avx(auVar2,0x19,5);
  auVar2 = vpinsrb_avx(auVar2,0x19,6);
  auVar2 = vpinsrb_avx(auVar2,0x19,7);
  auVar2 = vpinsrb_avx(auVar2,0x19,8);
  auVar2 = vpinsrb_avx(auVar2,0x19,9);
  auVar2 = vpinsrb_avx(auVar2,0x19,10);
  auVar2 = vpinsrb_avx(auVar2,0x19,0xb);
  auVar2 = vpinsrb_avx(auVar2,0x19,0xc);
  auVar2 = vpinsrb_avx(auVar2,0x19,0xd);
  auVar2 = vpinsrb_avx(auVar2,0x19,0xe);
  auVar2 = vpinsrb_avx(auVar2,0x19,0xf);
  auVar3 = vpinsrb_avx(ZEXT116(0x19),0x19,1);
  auVar3 = vpinsrb_avx(auVar3,0x19,2);
  auVar3 = vpinsrb_avx(auVar3,0x19,3);
  auVar3 = vpinsrb_avx(auVar3,0x19,4);
  auVar3 = vpinsrb_avx(auVar3,0x19,5);
  auVar3 = vpinsrb_avx(auVar3,0x19,6);
  auVar3 = vpinsrb_avx(auVar3,0x19,7);
  auVar3 = vpinsrb_avx(auVar3,0x19,8);
  auVar3 = vpinsrb_avx(auVar3,0x19,9);
  auVar3 = vpinsrb_avx(auVar3,0x19,10);
  auVar3 = vpinsrb_avx(auVar3,0x19,0xb);
  auVar3 = vpinsrb_avx(auVar3,0x19,0xc);
  auVar3 = vpinsrb_avx(auVar3,0x19,0xd);
  auVar3 = vpinsrb_avx(auVar3,0x19,0xe);
  auVar3 = vpinsrb_avx(auVar3,0x19,0xf);
  uStack_1b0 = auVar3._0_8_;
  uStack_1a8 = auVar3._8_8_;
  auVar8._8_8_ = in_XMM0_Qb;
  auVar8._0_8_ = in_XMM0_Qa;
  auVar8._16_8_ = in_YMM0_H;
  auVar8._24_8_ = in_register_00001218;
  auVar7._16_8_ = uStack_1b0;
  auVar7._0_16_ = auVar2;
  auVar7._24_8_ = uStack_1a8;
  auVar4 = vpcmpgtb_avx2(auVar8,auVar7);
  auVar4 = vpsubb_avx2(auVar5,auVar4);
  auVar5._16_8_ = uStack_250;
  auVar5._0_16_ = auVar1;
  auVar5._24_8_ = uStack_248;
  auVar4 = vpshufb_avx2(auVar5,auVar4);
  auVar9._8_8_ = in_XMM0_Qb;
  auVar9._0_8_ = in_XMM0_Qa;
  auVar9._16_8_ = in_YMM0_H;
  auVar9._24_8_ = in_register_00001218;
  vpaddb_avx2(auVar9,auVar4);
  return (__m256i *)0x19;
}

Assistant:

static inline __m128i
enc_translate (const __m128i in)
{
	// A lookup table containing the absolute offsets for all ranges:
	const __m128i lut = _mm_setr_epi8(
		 65,  71, -4, -4,
		 -4,  -4, -4, -4,
		 -4,  -4, -4, -4,
		-19, -16,  0,  0
	);

	// Translate values 0..63 to the Base64 alphabet. There are five sets:
	// #  From      To         Abs    Index  Characters
	// 0  [0..25]   [65..90]   +65        0  ABCDEFGHIJKLMNOPQRSTUVWXYZ
	// 1  [26..51]  [97..122]  +71        1  abcdefghijklmnopqrstuvwxyz
	// 2  [52..61]  [48..57]    -4  [2..11]  0123456789
	// 3  [62]      [43]       -19       12  +
	// 4  [63]      [47]       -16       13  /

	// Create LUT indices from the input. The index for range #0 is right,
	// others are 1 less than expected:
	__m128i indices = _mm_subs_epu8(in, _mm_set1_epi8(51));

	// mask is 0xFF (-1) for range #[1..4] and 0x00 for range #0:
	__m128i mask = _mm_cmpgt_epi8(in, _mm_set1_epi8(25));

	// Subtract -1, so add 1 to indices for range #[1..4]. All indices are
	// now correct:
	indices = _mm_sub_epi8(indices, mask);

	// Add offsets to input values:
	return _mm_add_epi8(in, _mm_shuffle_epi8(lut, indices));
}